

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::SamePadding::SerializeWithCachedSizes
          (SamePadding *this,CodedOutputStream *output)

{
  SamePadding_SamePaddingMode SVar1;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  SamePadding *this_local;
  
  SVar1 = asymmetrymode(this);
  if (SVar1 != SamePadding_SamePaddingMode_BOTTOM_RIGHT_HEAVY) {
    SVar1 = asymmetrymode(this);
    google::protobuf::internal::WireFormatLite::WriteEnum(1,SVar1,output);
  }
  return;
}

Assistant:

void SamePadding::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.SamePadding)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // .CoreML.Specification.SamePadding.SamePaddingMode asymmetryMode = 1;
  if (this->asymmetrymode() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteEnum(
      1, this->asymmetrymode(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.SamePadding)
}